

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# MiscExpressions.cpp
# Opt level: O2

Expression * __thiscall
slang::ast::AssertionInstanceExpression::bindPort
          (AssertionInstanceExpression *this,Symbol *symbol,SourceRange range,
          ASTContext *instanceCtx)

{
  group_type_pointer pgVar1;
  undefined4 uVar2;
  SymbolKind SVar3;
  Compilation *compilation;
  int *piVar4;
  value_type_pointer ppVar5;
  ASTContext *this_00;
  uint uVar6;
  undefined1 auVar7 [16];
  string_view arg;
  string_view arg_00;
  _Tuple_impl<0UL,_const_slang::syntax::PropertyExprSyntax_*,_slang::ast::ASTContext> *p_Var8;
  bool bVar9;
  int iVar10;
  undefined8 *puVar11;
  ulong uVar12;
  long lVar13;
  AssertionInstanceExpression *pAVar14;
  Type *pTVar15;
  Type *pTVar16;
  Diagnostic *pDVar17;
  undefined4 extraout_var;
  Expression *pEVar18;
  undefined4 extraout_var_00;
  undefined4 extraout_var_01;
  undefined4 extraout_var_02;
  SourceLocation this_01;
  AssertionInstanceDetails *pAVar19;
  ulong uVar20;
  SyntaxKind SVar21;
  ulong uVar22;
  ASTContext *instanceCtx_00;
  uint uVar23;
  ulong uVar24;
  AssertionInstanceDetails *pAVar25;
  uchar uVar26;
  uchar uVar27;
  uchar uVar28;
  byte bVar29;
  undefined1 auVar30 [16];
  SourceRange range_00;
  SourceRange sourceRange;
  SourceRange sourceRange_00;
  SourceRange sourceRange_01;
  SourceRange sourceRange_02;
  AssertionInstanceDetails details;
  ConversionKind local_14c;
  SourceRange local_148;
  SourceLocation local_138;
  Type *local_130;
  ExpressionSyntax *local_128;
  long local_120;
  ASTContext local_118;
  AssertionExpr *pAStack_e0;
  uchar local_d8;
  uchar uStack_d7;
  uchar uStack_d6;
  byte bStack_d5;
  uchar uStack_d4;
  uchar uStack_d3;
  uchar uStack_d2;
  byte bStack_d1;
  uchar uStack_d0;
  uchar uStack_cf;
  uchar uStack_ce;
  byte bStack_cd;
  uchar uStack_cc;
  uchar uStack_cb;
  uchar uStack_ca;
  byte bStack_c9;
  AssertionInstanceDetails local_c0;
  
  this_01 = range.endLoc;
  range_00.startLoc = range.startLoc;
  puVar11 = *(undefined8 **)this_01;
  pAVar19 = *(AssertionInstanceDetails **)((long)this_01 + 0x30);
  compilation = (Compilation *)*puVar11;
  local_148.startLoc = (SourceLocation)symbol;
  local_148.endLoc = range_00.startLoc;
  if (pAVar19 == (AssertionInstanceDetails *)0x0) {
    do {
      piVar4 = (int *)puVar11[1];
      if (*piVar4 == 0x58) {
        pAVar19 = *(AssertionInstanceDetails **)(piVar4 + 0x22);
        goto LAB_0033b061;
      }
      puVar11 = *(undefined8 **)(piVar4 + 8);
    } while (puVar11 != (undefined8 *)0x0);
  }
  else {
LAB_0033b061:
    pAVar25 = pAVar19->argDetails;
    if (pAVar19->argDetails == (AssertionInstanceDetails *)0x0) {
      pAVar25 = pAVar19;
    }
    auVar7._8_8_ = 0;
    auVar7._0_8_ = this;
    uVar20 = SUB168(auVar7 * ZEXT816(0x9e3779b97f4a7c15),8) ^
             SUB168(auVar7 * ZEXT816(0x9e3779b97f4a7c15),0);
    uVar12 = uVar20 >> ((byte)(pAVar25->argumentMap).table_.
                              super_table_core_impl<boost::unordered::detail::foa::flat_map_types<const_slang::ast::Symbol_*,_std::tuple<const_slang::syntax::PropertyExprSyntax_*,_slang::ast::ASTContext>_>,_slang::hash<const_slang::ast::Symbol_*>,_std::equal_to<const_slang::ast::Symbol_*>,_std::allocator<std::pair<const_slang::ast::Symbol_*const,_std::tuple<const_slang::syntax::PropertyExprSyntax_*,_slang::ast::ASTContext>_>_>_>
                              .arrays.groups_size_index & 0x3f);
    uVar2 = (&boost::unordered::detail::foa::group15<boost::unordered::detail::foa::plain_integral>
              ::match_word(unsigned_long)::word)[uVar20 & 0xff];
    uVar22 = 0;
    instanceCtx_00 =
         (ASTContext *)
         &boost::unordered::detail::foa::group15<boost::unordered::detail::foa::plain_integral>::
          is_not_overflowed(unsigned_long)::shift;
    do {
      pgVar1 = (pAVar25->argumentMap).table_.
               super_table_core_impl<boost::unordered::detail::foa::flat_map_types<const_slang::ast::Symbol_*,_std::tuple<const_slang::syntax::PropertyExprSyntax_*,_slang::ast::ASTContext>_>,_slang::hash<const_slang::ast::Symbol_*>,_std::equal_to<const_slang::ast::Symbol_*>,_std::allocator<std::pair<const_slang::ast::Symbol_*const,_std::tuple<const_slang::syntax::PropertyExprSyntax_*,_slang::ast::ASTContext>_>_>_>
               .arrays.groups_ + uVar12;
      local_d8 = pgVar1->m[0].n;
      uStack_d7 = pgVar1->m[1].n;
      uStack_d6 = pgVar1->m[2].n;
      bStack_d5 = pgVar1->m[3].n;
      uStack_d4 = pgVar1->m[4].n;
      uStack_d3 = pgVar1->m[5].n;
      uStack_d2 = pgVar1->m[6].n;
      bStack_d1 = pgVar1->m[7].n;
      uStack_d0 = pgVar1->m[8].n;
      uStack_cf = pgVar1->m[9].n;
      uStack_ce = pgVar1->m[10].n;
      bStack_cd = pgVar1->m[0xb].n;
      uStack_cc = pgVar1->m[0xc].n;
      uStack_cb = pgVar1->m[0xd].n;
      uStack_ca = pgVar1->m[0xe].n;
      bStack_c9 = pgVar1->m[0xf].n;
      uVar26 = (uchar)uVar2;
      auVar30[0] = -(local_d8 == uVar26);
      uVar27 = (uchar)((uint)uVar2 >> 8);
      auVar30[1] = -(uStack_d7 == uVar27);
      uVar28 = (uchar)((uint)uVar2 >> 0x10);
      auVar30[2] = -(uStack_d6 == uVar28);
      bVar29 = (byte)((uint)uVar2 >> 0x18);
      auVar30[3] = -(bStack_d5 == bVar29);
      auVar30[4] = -(uStack_d4 == uVar26);
      auVar30[5] = -(uStack_d3 == uVar27);
      auVar30[6] = -(uStack_d2 == uVar28);
      auVar30[7] = -(bStack_d1 == bVar29);
      auVar30[8] = -(uStack_d0 == uVar26);
      auVar30[9] = -(uStack_cf == uVar27);
      auVar30[10] = -(uStack_ce == uVar28);
      auVar30[0xb] = -(bStack_cd == bVar29);
      auVar30[0xc] = -(uStack_cc == uVar26);
      auVar30[0xd] = -(uStack_cb == uVar27);
      auVar30[0xe] = -(uStack_ca == uVar28);
      auVar30[0xf] = -(bStack_c9 == bVar29);
      uVar23 = (uint)(ushort)((ushort)(SUB161(auVar30 >> 7,0) & 1) |
                              (ushort)(SUB161(auVar30 >> 0xf,0) & 1) << 1 |
                              (ushort)(SUB161(auVar30 >> 0x17,0) & 1) << 2 |
                              (ushort)(SUB161(auVar30 >> 0x1f,0) & 1) << 3 |
                              (ushort)(SUB161(auVar30 >> 0x27,0) & 1) << 4 |
                              (ushort)(SUB161(auVar30 >> 0x2f,0) & 1) << 5 |
                              (ushort)(SUB161(auVar30 >> 0x37,0) & 1) << 6 |
                              (ushort)(SUB161(auVar30 >> 0x3f,0) & 1) << 7 |
                              (ushort)(SUB161(auVar30 >> 0x47,0) & 1) << 8 |
                              (ushort)(SUB161(auVar30 >> 0x4f,0) & 1) << 9 |
                              (ushort)(SUB161(auVar30 >> 0x57,0) & 1) << 10 |
                              (ushort)(SUB161(auVar30 >> 0x5f,0) & 1) << 0xb |
                              (ushort)(SUB161(auVar30 >> 0x67,0) & 1) << 0xc |
                              (ushort)(SUB161(auVar30 >> 0x6f,0) & 1) << 0xd |
                             (ushort)(SUB161(auVar30 >> 0x77,0) & 1) << 0xe);
      local_138 = (SourceLocation)symbol;
      if (uVar23 != 0) {
        ppVar5 = (pAVar25->argumentMap).table_.
                 super_table_core_impl<boost::unordered::detail::foa::flat_map_types<const_slang::ast::Symbol_*,_std::tuple<const_slang::syntax::PropertyExprSyntax_*,_slang::ast::ASTContext>_>,_slang::hash<const_slang::ast::Symbol_*>,_std::equal_to<const_slang::ast::Symbol_*>,_std::allocator<std::pair<const_slang::ast::Symbol_*const,_std::tuple<const_slang::syntax::PropertyExprSyntax_*,_slang::ast::ASTContext>_>_>_>
                 .arrays.elements_;
        do {
          uVar6 = 0;
          if (uVar23 != 0) {
            for (; (uVar23 >> uVar6 & 1) == 0; uVar6 = uVar6 + 1) {
            }
          }
          uVar24 = (ulong)uVar6;
          if ((AssertionInstanceExpression *)ppVar5[uVar12 * 0xf + uVar24].first == this) {
            pTVar15 = DeclaredType::getType((DeclaredType *)&this->arguments);
            pTVar16 = Type::getCanonicalType(pTVar15);
            SVar3 = (pTVar16->super_Symbol).kind;
            if ((SVar3 != UntypedType) && (SVar3 != ErrorType)) {
              uVar23 = (uint)((bitmask<slang::ast::ASTFlags> *)((long)this_01 + 0x10))->m_bits;
              if ((uVar23 >> 0x13 & 1) != 0) {
                if ((SVar3 != PredefinedIntegerType) ||
                   (pTVar16 = Type::getCanonicalType(pTVar15),
                   2 < (uint)pTVar16[1].super_Symbol.name._M_len)) {
                  sourceRange_00.endLoc = range_00.startLoc;
                  sourceRange_00.startLoc = local_138;
                  pDVar17 = ASTContext::addDiag((ASTContext *)this_01,(DiagCode)0x50007,
                                                sourceRange_00);
                  ast::operator<<(pDVar17,pTVar15);
                  Diagnostic::addNote(pDVar17,(DiagCode)0x50001,
                                      (SourceLocation)(this->super_Expression).syntax);
                  goto LAB_0033b416;
                }
                uVar23 = (uint)((bitmask<slang::ast::ASTFlags> *)((long)this_01 + 0x10))->m_bits;
              }
              if (((uVar23 >> 0x14 & 1) != 0) &&
                 (this[1].super_Expression.sourceRange.startLoc.field_0x4 == '\0')) {
                sourceRange_01.endLoc = range_00.startLoc;
                sourceRange_01.startLoc = local_138;
                pDVar17 = ASTContext::addDiag((ASTContext *)this_01,(DiagCode)0x80007,sourceRange_01
                                             );
                arg_00._M_len = *(size_t *)&(this->super_Expression).type;
                arg_00._M_str = (char *)(this->super_Expression).constant;
                Diagnostic::operator<<(pDVar17,arg_00);
                goto LAB_0033b416;
              }
            }
            uVar20 = ((bitmask<slang::ast::ASTFlags> *)((long)this_01 + 0x10))->m_bits;
            local_130 = pTVar15;
            if (((uint)uVar20 >> 0x17 & 1) == 0) {
              local_118.scope.ptr =
                   ppVar5[uVar12 * 0xf + uVar24].second.
                   super__Tuple_impl<0UL,_const_slang::syntax::PropertyExprSyntax_*,_slang::ast::ASTContext>
                   .super__Tuple_impl<1UL,_slang::ast::ASTContext>.
                   super__Head_base<1UL,_slang::ast::ASTContext,_false>._M_head_impl.scope.ptr;
              p_Var8 = &ppVar5[uVar12 * 0xf + uVar24].second.
                        super__Tuple_impl<0UL,_const_slang::syntax::PropertyExprSyntax_*,_slang::ast::ASTContext>
              ;
              local_118.lookupIndex =
                   (p_Var8->super__Tuple_impl<1UL,_slang::ast::ASTContext>).
                   super__Head_base<1UL,_slang::ast::ASTContext,_false>._M_head_impl.lookupIndex;
              local_118._12_4_ =
                   *(undefined4 *)
                    &(p_Var8->super__Tuple_impl<1UL,_slang::ast::ASTContext>).
                     super__Head_base<1UL,_slang::ast::ASTContext,_false>._M_head_impl.field_0xc;
              local_118.flags.m_bits =
                   ppVar5[uVar12 * 0xf + uVar24].second.
                   super__Tuple_impl<0UL,_const_slang::syntax::PropertyExprSyntax_*,_slang::ast::ASTContext>
                   .super__Tuple_impl<1UL,_slang::ast::ASTContext>.
                   super__Head_base<1UL,_slang::ast::ASTContext,_false>._M_head_impl.flags.m_bits;
              local_118.instanceOrProc =
                   ppVar5[uVar12 * 0xf + uVar24].second.
                   super__Tuple_impl<0UL,_const_slang::syntax::PropertyExprSyntax_*,_slang::ast::ASTContext>
                   .super__Tuple_impl<1UL,_slang::ast::ASTContext>.
                   super__Head_base<1UL,_slang::ast::ASTContext,_false>._M_head_impl.instanceOrProc;
              local_118.firstTempVar =
                   ppVar5[uVar12 * 0xf + uVar24].second.
                   super__Tuple_impl<0UL,_const_slang::syntax::PropertyExprSyntax_*,_slang::ast::ASTContext>
                   .super__Tuple_impl<1UL,_slang::ast::ASTContext>.
                   super__Head_base<1UL,_slang::ast::ASTContext,_false>._M_head_impl.firstTempVar;
              local_118.randomizeDetails =
                   ppVar5[uVar12 * 0xf + uVar24].second.
                   super__Tuple_impl<0UL,_const_slang::syntax::PropertyExprSyntax_*,_slang::ast::ASTContext>
                   .super__Tuple_impl<1UL,_slang::ast::ASTContext>.
                   super__Head_base<1UL,_slang::ast::ASTContext,_false>._M_head_impl.
                   randomizeDetails;
              local_118.assertionInstance =
                   ppVar5[uVar12 * 0xf + uVar24].second.
                   super__Tuple_impl<0UL,_const_slang::syntax::PropertyExprSyntax_*,_slang::ast::ASTContext>
                   .super__Tuple_impl<1UL,_slang::ast::ASTContext>.
                   super__Head_base<1UL,_slang::ast::ASTContext,_false>._M_head_impl.
                   assertionInstance;
              pAStack_e0 = (AssertionExpr *)
                           ppVar5[uVar12 * 0xf + uVar24].second.
                           super__Tuple_impl<0UL,_const_slang::syntax::PropertyExprSyntax_*,_slang::ast::ASTContext>
                           .super__Head_base<0UL,_const_slang::syntax::PropertyExprSyntax_*,_false>.
                           _M_head_impl;
              if (pAStack_e0 == (AssertionExpr *)0x0) {
                pAVar14 = (AssertionInstanceExpression *)
                          Expression::badExpr(compilation,(Expression *)0x0);
                return &pAVar14->super_Expression;
              }
              decomposePropExpr((PropertyExprSyntax *)pAStack_e0);
              local_118.flags.m_bits = local_118.flags.m_bits | uVar20;
              AssertionInstanceDetails::AssertionInstanceDetails(&local_c0);
              local_c0.argExpansionLoc = local_148.startLoc;
              local_c0.argDetails = local_118.assertionInstance;
              local_118.assertionInstance = &local_c0;
              local_c0.prevContext = (ASTContext *)this_01;
              if (SVar3 - SequenceType < 2) {
                iVar10 = AssertionExpr::bind(pAStack_e0,(int)&local_118,(sockaddr *)0x0,0);
                SVar21 = PropertyType;
                if (SVar3 == SequenceType) {
                  SVar21 = SequenceType;
                }
                pTVar15 = Compilation::getType(compilation,SVar21);
                local_14c = local_14c & 0xffffff00;
                pAVar14 = BumpAllocator::
                          emplace<slang::ast::AssertionInstanceExpression,slang::ast::Type_const&,slang::ast::AssertionPortSymbol_const&,slang::ast::AssertionExpr_const&,bool,slang::SourceRange&>
                                    ((BumpAllocator *)compilation,pTVar15,
                                     (AssertionPortSymbol *)this,
                                     (AssertionExpr *)CONCAT44(extraout_var,iVar10),
                                     (bool *)&local_14c,&local_148);
                goto LAB_0033b4ed;
              }
              if (SVar3 == EventType) {
                if ((~(uint)((bitmask<slang::ast::ASTFlags> *)((long)this_01 + 0x10))->m_bits &
                    0x24000) == 0) {
                  iVar10 = TimingControl::bind((int)pAStack_e0,(sockaddr *)&local_118,
                                               local_148.startLoc._0_4_);
                  pAVar14 = (AssertionInstanceExpression *)
                            BumpAllocator::
                            emplace<slang::ast::ClockingEventExpression,slang::ast::Type_const&,slang::ast::TimingControl&,slang::SourceRange&>
                                      ((BumpAllocator *)compilation,compilation->voidType,
                                       (TimingControl *)CONCAT44(extraout_var_00,iVar10),&local_148)
                  ;
                  goto LAB_0033b4ed;
                }
                sourceRange_02.endLoc = local_148.endLoc;
                sourceRange_02.startLoc = local_148.startLoc;
                ASTContext::addDiag((ASTContext *)this_01,(DiagCode)0x500007,sourceRange_02);
              }
              else {
                if (SVar3 == UntypedType) {
                  if (local_128 == (ExpressionSyntax *)0x0) {
                    if ((~(uint)((bitmask<slang::ast::ASTFlags> *)((long)this_01 + 0x10))->m_bits &
                        0x24000) == 0) {
                      iVar10 = TimingControl::bind((int)pAStack_e0,(sockaddr *)&local_118,
                                                   local_148.startLoc._0_4_);
                      pAVar14 = (AssertionInstanceExpression *)
                                BumpAllocator::
                                emplace<slang::ast::ClockingEventExpression,slang::ast::Type_const&,slang::ast::TimingControl&,slang::SourceRange&>
                                          ((BumpAllocator *)compilation,compilation->voidType,
                                           (TimingControl *)CONCAT44(extraout_var_01,iVar10),
                                           &local_148);
                    }
                    else {
                      iVar10 = AssertionExpr::bind(pAStack_e0,(int)&local_118,(sockaddr *)0x0,0);
                      SVar21 = SequenceType;
                      if (local_120 == 0) {
                        SVar21 = PropertyType;
                      }
                      pTVar15 = Compilation::getType(compilation,SVar21);
                      local_14c = local_14c & 0xffffff00;
                      pAVar14 = BumpAllocator::
                                emplace<slang::ast::AssertionInstanceExpression,slang::ast::Type_const&,slang::ast::AssertionPortSymbol_const&,slang::ast::AssertionExpr_const&,bool,slang::SourceRange&>
                                          ((BumpAllocator *)compilation,pTVar15,
                                           (AssertionPortSymbol *)this,
                                           (AssertionExpr *)CONCAT44(extraout_var_02,iVar10),
                                           (bool *)&local_14c,&local_148);
                    }
                  }
                  else {
                    pAVar14 = (AssertionInstanceExpression *)
                              Expression::selfDetermined
                                        (compilation,local_128,&local_118,local_118.flags);
                    (pAVar14->super_Expression).sourceRange.startLoc = local_148.startLoc;
                    (pAVar14->super_Expression).sourceRange.endLoc = local_148.endLoc;
                  }
                  goto LAB_0033b4ed;
                }
                if (local_128 != (ExpressionSyntax *)0x0) {
                  pAVar14 = (AssertionInstanceExpression *)
                            Expression::selfDetermined
                                      (compilation,local_128,&local_118,local_118.flags);
                  pTVar15 = local_130;
                  (pAVar14->super_Expression).sourceRange.startLoc = local_148.startLoc;
                  (pAVar14->super_Expression).sourceRange.endLoc = local_148.endLoc;
                  if (((*(byte *)((long)this_01 + 0x12) & 0x10) == 0) &&
                     (bVar9 = Type::isMatching((pAVar14->super_Expression).type.ptr,local_130),
                     !bVar9)) {
                    local_14c = Explicit;
                    pAVar14 = (AssertionInstanceExpression *)
                              BumpAllocator::
                              emplace<slang::ast::ConversionExpression,slang::ast::Type_const&,slang::ast::ConversionKind,slang::ast::Expression&,slang::SourceRange&>
                                        ((BumpAllocator *)compilation,pTVar15,&local_14c,
                                         (Expression *)pAVar14,&local_148);
                  }
                  goto LAB_0033b4ed;
                }
              }
              pAVar14 = (AssertionInstanceExpression *)
                        Expression::badExpr(compilation,(Expression *)0x0);
LAB_0033b4ed:
              AssertionInstanceDetails::~AssertionInstanceDetails(&local_c0);
              return &pAVar14->super_Expression;
            }
            sourceRange.endLoc = range_00.startLoc;
            sourceRange.startLoc = local_138;
            pDVar17 = ASTContext::addDiag((ASTContext *)this_01,(DiagCode)0x8d0007,sourceRange);
            arg._M_len = *(size_t *)&(this->super_Expression).type;
            arg._M_str = (char *)(this->super_Expression).constant;
            Diagnostic::operator<<(pDVar17,arg);
            goto LAB_0033b416;
          }
          uVar23 = uVar23 - 1 & uVar23;
        } while (uVar23 != 0);
      }
      if (((&boost::unordered::detail::foa::group15<boost::unordered::detail::foa::plain_integral>::
             is_not_overflowed(unsigned_long)::shift)[(uint)uVar20 & 7] & bStack_c9) == 0) break;
      uVar24 = (pAVar25->argumentMap).table_.
               super_table_core_impl<boost::unordered::detail::foa::flat_map_types<const_slang::ast::Symbol_*,_std::tuple<const_slang::syntax::PropertyExprSyntax_*,_slang::ast::ASTContext>_>,_slang::hash<const_slang::ast::Symbol_*>,_std::equal_to<const_slang::ast::Symbol_*>,_std::allocator<std::pair<const_slang::ast::Symbol_*const,_std::tuple<const_slang::syntax::PropertyExprSyntax_*,_slang::ast::ASTContext>_>_>_>
               .arrays.groups_size_mask;
      lVar13 = uVar12 + uVar22;
      uVar22 = uVar22 + 1;
      uVar12 = lVar13 + 1U & uVar24;
    } while (uVar22 <= uVar24);
    while (this_00 = pAVar25->prevContext, this_00 != (ASTContext *)0x0) {
      pAVar25 = this_00->assertionInstance;
      if ((pAVar25 == (AssertionInstanceDetails *)0x0) ||
         ((pAVar25->symbol != (Symbol *)0x0 && (pAVar25->symbol->kind == Checker)))) {
        ASTContext::resetFlags
                  ((ASTContext *)&local_c0,this_00,
                   (bitmask<slang::ast::ASTFlags>)
                   ((bitmask<slang::ast::ASTFlags> *)((long)this_01 + 0x10))->m_bits);
        range_00.endLoc = (SourceLocation)&local_c0;
        pAVar14 = (AssertionInstanceExpression *)
                  bindPort(this,(Symbol *)local_138,range_00,instanceCtx_00);
        return &pAVar14->super_Expression;
      }
    }
  }
LAB_0033b416:
  pEVar18 = Expression::badExpr(compilation,(Expression *)0x0);
  return pEVar18;
}

Assistant:

Expression& AssertionInstanceExpression::bindPort(const Symbol& symbol, SourceRange range,
                                                  const ASTContext& instanceCtx) {
    Compilation& comp = instanceCtx.getCompilation();

    auto inst = instanceCtx.assertionInstance;
    if (!inst) {
        // This is only possible if we're in a checker instance,
        // so look upward until we find it.
        auto sym = &instanceCtx.scope->asSymbol();
        while (sym->kind != SymbolKind::CheckerInstanceBody) {
            auto scope = sym->getParentScope();
            if (!scope)
                return badExpr(comp, nullptr);

            sym = &scope->asSymbol();
        }

        inst = &sym->as<CheckerInstanceBodySymbol>().assertionDetails;
    }

    // When looking up an argument reference from within another expanded
    // argument, use that original location's context.
    if (inst->argDetails)
        inst = inst->argDetails;

    // The only way to reference an assertion port should be from within
    // an assertion or checker instance.
    auto it = inst->argumentMap.find(&symbol);
    if (it == inst->argumentMap.end()) {
        // Walk through our previous assertion contexts to see if one of
        // them is a checker instance, in which case this argument might
        // be a reference to a checker port.
        auto ctx = inst->prevContext;
        while (ctx) {
            inst = ctx->assertionInstance;
            if (!inst || (inst->symbol && inst->symbol->kind == SymbolKind::Checker))
                return bindPort(symbol, range, ctx->resetFlags(instanceCtx.flags));

            ctx = inst->prevContext;
        }

        SLANG_ASSERT(false);
        return badExpr(comp, nullptr);
    }

    auto& formal = symbol.as<AssertionPortSymbol>();
    auto& type = formal.declaredType.getType();
    auto typeKind = type.getCanonicalType().kind;

    if (typeKind != SymbolKind::ErrorType && typeKind != SymbolKind::UntypedType) {
        if (instanceCtx.flags.has(ASTFlags::AssertionDelayOrRepetition)) {
            auto isAllowedIntType = [&] {
                if (typeKind != SymbolKind::PredefinedIntegerType)
                    return false;

                auto ik = type.getCanonicalType().as<PredefinedIntegerType>().integerKind;
                return ik == PredefinedIntegerType::Int || ik == PredefinedIntegerType::ShortInt ||
                       ik == PredefinedIntegerType::LongInt;
            };

            if (!isAllowedIntType()) {
                auto& diag = instanceCtx.addDiag(diag::AssertionDelayFormalType, range);
                diag << type;
                diag.addNote(diag::NoteDeclarationHere, formal.location);
                return badExpr(comp, nullptr);
            }
        }

        if (instanceCtx.flags.has(ASTFlags::LValue) && !formal.direction) {
            instanceCtx.addDiag(diag::AssertionPortTypedLValue, range) << formal.name;
            return badExpr(comp, nullptr);
        }
    }

    if (instanceCtx.flags.has(ASTFlags::RecursivePropertyArg)) {
        instanceCtx.addDiag(diag::RecursivePropArgExpr, range) << formal.name;
        return badExpr(comp, nullptr);
    }

    auto [propExpr, argCtx] = it->second;
    if (!propExpr) {
        // The expression can be null when making default instances of
        // sequences and properties. Just return an invalid expression.
        return badExpr(comp, nullptr);
    }

    auto [seqExpr, regExpr] = decomposePropExpr(*propExpr);

    // Inherit any AST flags that are specific to this argument's instantiation.
    argCtx.flags |= instanceCtx.flags;

    AssertionInstanceDetails details;
    details.argExpansionLoc = range.start();
    details.prevContext = &instanceCtx;
    details.argDetails = argCtx.assertionInstance;
    argCtx.assertionInstance = &details;

    switch (typeKind) {
        case SymbolKind::UntypedType:
            // Untyped formals allow everything. Bind as a regular expression
            // if possible and fall back to an assertion expression if not.
            if (regExpr) {
                auto& result = selfDetermined(comp, *regExpr, argCtx, argCtx.flags);
                result.sourceRange = range;
                return result;
            }
            else if (instanceCtx.flags.has(ASTFlags::EventExpression) &&
                     instanceCtx.flags.has(ASTFlags::AllowClockingBlock)) {
                // In an event expression, a referenced argument gets interpreted
                // as an event expression itself and not as an assertion expression.
                auto& timing = TimingControl::bind(*propExpr, argCtx);
                return *comp.emplace<ClockingEventExpression>(comp.getVoidType(), timing, range);
            }
            else {
                auto& result = AssertionExpr::bind(*propExpr, argCtx);
                auto& resultType = seqExpr ? comp.getType(SyntaxKind::SequenceType)
                                           : comp.getType(SyntaxKind::PropertyType);
                return *comp.emplace<AssertionInstanceExpression>(resultType, formal, result,
                                                                  /* isRecursiveProperty */ false,
                                                                  range);
            }
        case SymbolKind::SequenceType:
        case SymbolKind::PropertyType: {
            auto& result = AssertionExpr::bind(*propExpr, argCtx);
            auto& resultType = typeKind == SymbolKind::SequenceType
                                   ? comp.getType(SyntaxKind::SequenceType)
                                   : comp.getType(SyntaxKind::PropertyType);

            return *comp.emplace<AssertionInstanceExpression>(resultType, formal, result,
                                                              /* isRecursiveProperty */ false,
                                                              range);
        }
        case SymbolKind::EventType:
            // If an event expression is allowed here, bind and return. Otherwise issue
            // an error, since an 'event' argument can only be used where event expressions
            // are allowed, regardless of what the actual argument expression looks like.
            if (instanceCtx.flags.has(ASTFlags::EventExpression) &&
                instanceCtx.flags.has(ASTFlags::AllowClockingBlock)) {
                auto& timing = TimingControl::bind(*propExpr, argCtx);
                return *comp.emplace<ClockingEventExpression>(comp.getVoidType(), timing, range);
            }

            instanceCtx.addDiag(diag::EventExprAssertionArg, range);
            return badExpr(comp, nullptr);
        default: {
            // Arguments should have already been checked for type correctness.
            if (!regExpr)
                return badExpr(comp, nullptr);

            auto& expr = selfDetermined(comp, *regExpr, argCtx, argCtx.flags);
            expr.sourceRange = range;

            if (!instanceCtx.flags.has(ASTFlags::LValue) && !expr.type->isMatching(type)) {
                return *comp.emplace<ConversionExpression>(type, ConversionKind::Explicit, expr,
                                                           range);
            }

            return expr;
        }
    }
}